

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O1

void ipred_plane_uv(pel *src,pel *dst,int i_dst,int w,int h,int bit_depth)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  pel pVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  pel pVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  byte *pbVar23;
  
  iVar22 = w >> 1;
  uVar4 = h >> 1;
  lVar6 = (long)w;
  uVar7 = (ulong)h;
  iVar16 = 0;
  iVar8 = 0;
  iVar10 = 0;
  if (0 < iVar22) {
    pbVar23 = src + lVar6 + -1;
    iVar10 = 0;
    uVar19 = 1;
    iVar8 = 0;
    do {
      iVar10 = iVar10 + ((uint)src[uVar19 * 2 + lVar6] - (uint)pbVar23[-1]) * (int)uVar19;
      iVar8 = iVar8 + ((uint)src[uVar19 * 2 + lVar6 + 1] - (uint)*pbVar23) * (int)uVar19;
      uVar19 = uVar19 + 1;
      pbVar23 = pbVar23 + -2;
    } while (iVar22 + 1 != uVar19);
  }
  iVar18 = 0;
  if (0 < (int)uVar4) {
    pbVar23 = src + ~uVar7;
    uVar19 = 0;
    iVar18 = 0;
    iVar16 = 0;
    do {
      lVar1 = uVar19 * 2;
      lVar20 = uVar19 * 2;
      uVar19 = uVar19 + 1;
      iVar18 = iVar18 + ((uint)pbVar23[-1] - (uint)src[lVar1 + (2 - uVar7)]) * (int)uVar19;
      iVar16 = iVar16 + ((uint)*pbVar23 - (uint)src[lVar20 + (3 - uVar7)]) * (int)uVar19;
      pbVar23 = pbVar23 + -2;
    } while (uVar4 != uVar19);
  }
  bVar2 = (byte)*(undefined4 *)(&DAT_0017ea38 + (long)g_tbl_log2[lVar6] * 4);
  iVar13 = 1 << (bVar2 - 1 & 0x1f);
  iVar11 = iVar10 * *(int *)(&DAT_0017ea18 + (long)g_tbl_log2[lVar6] * 4) * 0x20 + iVar13 >>
           (bVar2 & 0x1f);
  bVar3 = (byte)*(undefined4 *)(&DAT_0017ea38 + (long)g_tbl_log2[uVar7] * 4);
  iVar10 = 1 << (bVar3 - 1 & 0x1f);
  iVar18 = iVar18 * *(int *)(&DAT_0017ea18 + (long)g_tbl_log2[uVar7] * 4) * 0x20 + iVar10 >>
           (bVar3 & 0x1f);
  iVar8 = *(int *)(&DAT_0017ea18 + (long)g_tbl_log2[lVar6] * 4) * 0x20 * iVar8 + iVar13 >>
          (bVar2 & 0x1f);
  iVar10 = *(int *)(&DAT_0017ea18 + (long)g_tbl_log2[uVar7] * 4) * 0x20 * iVar16 + iVar10 >>
           (bVar3 & 0x1f);
  if (0 < h) {
    lVar6 = (long)(w * 2);
    uVar21 = ~(-1 << ((byte)bit_depth & 0x1f));
    iVar16 = (((uint)src[(long)(h * -2) + 1] + (uint)src[lVar6 + 1]) * 0x10 -
             (iVar8 * (iVar22 + -1) + iVar10 * (uVar4 - 1))) + 0x10;
    iVar13 = (((uint)src[h * -2] + (uint)src[lVar6]) * 0x10 -
             ((iVar22 + -1) * iVar11 + (uVar4 - 1) * iVar18)) + 0x10;
    iVar22 = 0;
    do {
      if (0 < w * 2) {
        lVar20 = 0;
        iVar5 = iVar16;
        iVar15 = iVar13;
        do {
          uVar14 = iVar15 >> 5;
          uVar9 = iVar5 >> 5;
          iVar15 = iVar15 + iVar11;
          iVar5 = iVar5 + iVar8;
          uVar4 = uVar21;
          if ((int)uVar14 < (int)uVar21) {
            uVar4 = uVar14;
          }
          pVar17 = (pel)uVar4;
          if ((int)uVar14 < 0) {
            pVar17 = '\0';
          }
          uVar4 = uVar21;
          if ((int)uVar9 < (int)uVar21) {
            uVar4 = uVar9;
          }
          pVar12 = (pel)uVar4;
          if ((int)uVar9 < 0) {
            pVar12 = '\0';
          }
          dst[lVar20] = pVar17;
          dst[lVar20 + 1] = pVar12;
          lVar20 = lVar20 + 2;
        } while (lVar20 < lVar6);
      }
      iVar13 = iVar13 + iVar18;
      iVar16 = iVar16 + iVar10;
      dst = dst + i_dst;
      iVar22 = iVar22 + 1;
    } while (iVar22 != h);
  }
  return;
}

Assistant:

void ipred_plane_uv(pel *src, pel *dst, int i_dst, int w, int h, int bit_depth)
{
    uavs3d_assert(g_tbl_log2[w] >= 2);
    uavs3d_assert(g_tbl_log2[h] >= 2);

    pel *rsrc;
    int  coef_hor_u = 0, coef_ver_u = 0;
    int  coef_hor_v = 0, coef_ver_v = 0;
    int  a_u, b_u, c_u, a_v, b_v, c_v, x, y;
    int  w2 = w >> 1;
    int  h2 = h >> 1;
    int  width2  = w << 1;
    int  height2 = h << 1;
    int  ib_mult[5] = { 13, 17, 5, 11, 23 };
    int  ib_shift[5] = { 7, 10, 11, 15, 19 };
    int  idx_w = g_tbl_log2[w] - 2;
    int  idx_h = g_tbl_log2[h] - 2;
    int  im_h, is_h, im_v, is_v;
    int  temp_u, temp_v;
    int  max_pel = (1 << bit_depth) - 1;
    int  val_u, val_v;

    im_h = ib_mult[idx_w];
    is_h = ib_shift[idx_w];
    im_v = ib_mult[idx_h];
    is_v = ib_shift[idx_h];
    rsrc = src + w;
    for (x = 1; x < w2 + 1; x++)
    {
        int x2 = x << 1;
        coef_hor_u += x * (rsrc[x2] - rsrc[-x2]);
        coef_hor_v += x * (rsrc[x2 + 1] - rsrc[-x2 + 1]);
    }
    rsrc = src - h;
    for (y = 1; y < h2 + 1; y++)
    {
        int y2 = y << 1;
        coef_ver_u += y * (rsrc[-y2] - rsrc[y2]);
        coef_ver_v += y * (rsrc[-y2 + 1] - rsrc[y2 + 1]);
    }
    a_u = (src[-height2] + src[width2]) << 4;
    b_u = ((coef_hor_u << 5) * im_h + (1 << (is_h - 1))) >> is_h;
    c_u = ((coef_ver_u << 5) * im_v + (1 << (is_v - 1))) >> is_v;
    a_v = (src[-height2 + 1] + src[width2 + 1]) << 4;
    b_v = ((coef_hor_v << 5) * im_h + (1 << (is_h - 1))) >> is_h;
    c_v = ((coef_ver_v << 5) * im_v + (1 << (is_v - 1))) >> is_v;
    temp_u = a_u - (h2 - 1) * c_u - (w2 - 1) * b_u + 16;
    temp_v = a_v - (h2 - 1) * c_v - (w2 - 1) * b_v + 16;

    for (y = 0; y < h; y++) {
        int temp2_u = temp_u;
        int temp2_v = temp_v;
        for (x = 0; x < width2; x += 2) {
            val_u = temp2_u >> 5;
            val_v = temp2_v >> 5;
            temp2_u += b_u;
            temp2_v += b_v;
            dst[x    ] = COM_CLIP3(0, max_pel, val_u);
            dst[x + 1] = COM_CLIP3(0, max_pel, val_v);
        }
        temp_u += c_u;
        temp_v += c_v;
        dst += i_dst;
    }
}